

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_surjectionproof_verify
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,
              secp256k1_generator *ephemeral_input_tags,size_t n_ephemeral_input_tags,
              secp256k1_generator *ephemeral_output_tag)

{
  ulong uVar1;
  int iVar2;
  void *pvVar3;
  secp256k1_scalar *r;
  char *pcVar4;
  uchar *b32;
  long lVar5;
  size_t *in_stack_ffffffffffff5f80;
  size_t rsizes [1];
  uchar msg32 [32];
  secp256k1_scalar borromean_s [256];
  secp256k1_gej ring_pubkeys [256];
  
  if (proof == (secp256k1_surjectionproof *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "proof != NULL";
  }
  else if (ephemeral_input_tags == (secp256k1_generator *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "ephemeral_input_tags != NULL";
  }
  else {
    if (ephemeral_output_tag != (secp256k1_generator *)0x0) {
      uVar1 = proof->n_inputs;
      rsizes[0] = secp256k1_surjectionproof_n_used_inputs(ctx,proof);
      if (0x100 < rsizes[0]) {
        return 0;
      }
      if (uVar1 == n_ephemeral_input_tags) {
        if (uVar1 <= rsizes[0] - 1) {
          return 0;
        }
        secp256k1_surjection_compute_public_keys
                  (ring_pubkeys,(size_t)ephemeral_input_tags,
                   (secp256k1_generator *)n_ephemeral_input_tags,(size_t)proof->used_inputs,
                   ephemeral_output_tag->data,(secp256k1_generator *)0x0,0,in_stack_ffffffffffff5f80
                  );
        lVar5 = rsizes[0] + 1;
        b32 = proof->data;
        r = borromean_s;
        do {
          b32 = b32 + 0x20;
          lVar5 = lVar5 + -1;
          if (lVar5 == 0) {
            secp256k1_surjection_genmessage
                      (msg32,ephemeral_input_tags,n_ephemeral_input_tags,ephemeral_output_tag);
            iVar2 = secp256k1_borromean_verify
                              ((secp256k1_scalar *)0x0,proof->data,borromean_s,ring_pubkeys,rsizes,1
                               ,msg32,0x20);
            return iVar2;
          }
          msg32[0] = '\0';
          msg32[1] = '\0';
          msg32[2] = '\0';
          msg32[3] = '\0';
          secp256k1_scalar_set_b32(r,b32,(int *)msg32);
          r = r + 1;
        } while (msg32._0_4_ != 1);
        return 0;
      }
      return 0;
    }
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "ephemeral_output_tag != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar4,pvVar3);
  return 0;
}

Assistant:

int secp256k1_surjectionproof_verify(const secp256k1_context* ctx, const secp256k1_surjectionproof* proof, const secp256k1_generator* ephemeral_input_tags, size_t n_ephemeral_input_tags, const secp256k1_generator* ephemeral_output_tag) {
    size_t rsizes[1];    /* array needed for borromean sig API */
    size_t i;
    size_t n_total_pubkeys;
    size_t n_used_pubkeys;
    secp256k1_gej ring_pubkeys[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    secp256k1_scalar borromean_s[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    unsigned char msg32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(ephemeral_input_tags != NULL);
    ARG_CHECK(ephemeral_output_tag != NULL);

    /* Compute public keys */
    n_total_pubkeys = secp256k1_surjectionproof_n_total_inputs(ctx, proof);
    n_used_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx, proof);
    if (n_used_pubkeys == 0 || n_used_pubkeys > n_total_pubkeys || n_total_pubkeys != n_ephemeral_input_tags) {
        return 0;
    }

    /* Reject proofs with too many used inputs in USE_REDUCED_SURJECTION_PROOF_SIZE mode */
    if (n_used_pubkeys > SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS) {
        return 0;
    }

    if (secp256k1_surjection_compute_public_keys(ring_pubkeys, n_used_pubkeys, ephemeral_input_tags, n_total_pubkeys, proof->used_inputs, ephemeral_output_tag, 0, NULL) == 0) {
        return 0;
    }

    /* Verify signature */
    rsizes[0] = (int) n_used_pubkeys;
    for (i = 0; i < n_used_pubkeys; i++) {
        int overflow = 0;
        secp256k1_scalar_set_b32(&borromean_s[i], &proof->data[32 + 32 * i], &overflow);
        if (overflow == 1) {
            return 0;
        }
    }
    secp256k1_surjection_genmessage(msg32, ephemeral_input_tags, n_total_pubkeys, ephemeral_output_tag);
    return secp256k1_borromean_verify(NULL, &proof->data[0], borromean_s, ring_pubkeys, rsizes, 1, msg32, 32);
}